

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O0

void gravity_lexer_skip_line(gravity_lexer_t *lexer)

{
  _Bool _Var1;
  int local_14;
  gravity_lexer_t *pgStack_10;
  int c;
  gravity_lexer_t *lexer_local;
  
  pgStack_10 = lexer;
  do {
    if (pgStack_10->length <= pgStack_10->offset) {
      return;
    }
    local_14 = 0;
    next_utf8(pgStack_10,&local_14);
    _Var1 = is_newline(pgStack_10,local_14);
  } while (!_Var1);
  pgStack_10->lineno = pgStack_10->lineno + 1;
  pgStack_10->colno = 1;
  return;
}

Assistant:

void gravity_lexer_skip_line (gravity_lexer_t *lexer) {
    while (!IS_EOF) {
        int c = 0;
        next_utf8(lexer, &c);
        if (is_newline(lexer, c)) {
            INC_LINE;
            break;
        }
    }
}